

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O1

void gen_bnz(dill_stream s,int conditional,int target_label,int op_type)

{
  short sVar1;
  short sVar2;
  jmp_data *pjVar3;
  int iVar4;
  int iVar5;
  branch_opi UNRECOVERED_JUMPTABLE_00;
  branch_op UNRECOVERED_JUMPTABLE;
  
  switch(op_type) {
  case 4:
    pjVar3 = s->j->b_data;
    UNRECOVERED_JUMPTABLE_00 = s->j->jmp_bi[0x3b];
    iVar5 = (int)pjVar3[0x3b].data1;
    iVar4 = (int)pjVar3[0x3b].data2;
    break;
  case 5:
    pjVar3 = s->j->b_data;
    UNRECOVERED_JUMPTABLE_00 = s->j->jmp_bi[0x3c];
    iVar5 = (int)pjVar3[0x3c].data1;
    iVar4 = (int)pjVar3[0x3c].data2;
    break;
  case 6:
    pjVar3 = s->j->b_data;
    UNRECOVERED_JUMPTABLE_00 = s->j->jmp_bi[0x3d];
    iVar5 = (int)pjVar3[0x3d].data1;
    iVar4 = (int)pjVar3[0x3d].data2;
    break;
  case 7:
    pjVar3 = s->j->b_data;
    UNRECOVERED_JUMPTABLE_00 = s->j->jmp_bi[0x3e];
    iVar5 = (int)pjVar3[0x3e].data1;
    iVar4 = (int)pjVar3[0x3e].data2;
    break;
  case 8:
    pjVar3 = s->j->b_data;
    UNRECOVERED_JUMPTABLE_00 = s->j->jmp_bi[0x3f];
    iVar5 = (int)pjVar3[0x3f].data1;
    iVar4 = (int)pjVar3[0x3f].data2;
    break;
  case 9:
    iVar4 = dill_getreg(s,9);
    (*s->j->setf)(s,9,0,iVar4,0.0);
    pjVar3 = s->j->b_data;
    UNRECOVERED_JUMPTABLE = s->j->jmp_b[0x40];
    sVar1 = pjVar3[0x40].data1;
    sVar2 = pjVar3[0x40].data2;
    goto LAB_0012c0c2;
  case 10:
    iVar4 = dill_getreg(s,10);
    (*s->j->setf)(s,10,0,iVar4,0.0);
    pjVar3 = s->j->b_data;
    UNRECOVERED_JUMPTABLE = s->j->jmp_b[0x41];
    sVar1 = pjVar3[0x41].data1;
    sVar2 = pjVar3[0x41].data2;
LAB_0012c0c2:
    (*UNRECOVERED_JUMPTABLE)(s,(int)sVar1,(int)sVar2,conditional,iVar4,target_label);
    return;
  default:
    gen_bnz_cold_1();
    return;
  }
  (*UNRECOVERED_JUMPTABLE_00)(s,iVar5,iVar4,conditional,0,target_label);
  return;
}

Assistant:

static void
gen_bnz(dill_stream s, int conditional, int target_label, int op_type)
{
    switch(op_type) {
    case DILL_I:
	dill_bneii(s, conditional, 0, target_label);	/* op_i_bneii */
	break;
    case DILL_U:
	dill_bneui(s, conditional, 0, target_label);	/* op_i_bneui */
	break;
    case DILL_L:
	dill_bneli(s, conditional, 0, target_label);	/* op_i_bneli */
	break;
    case DILL_P:
	dill_bnepi(s, conditional, 0, target_label);	/* op_i_bnepi */
	break;
    case DILL_UL:
	dill_bneuli(s, conditional, 0, target_label);	/* op_i_bneuli */
	break;
    case DILL_F: {
	dill_reg tmp = dill_getreg(s, DILL_F);
	dill_setf(s, tmp, 0.0);	/* op_i_setf */
	dill_bnef(s, conditional, tmp, target_label);
	break;
    }
    case DILL_D: {
	dill_reg tmp = dill_getreg(s, DILL_D);
	dill_setd(s, tmp, 0.0);
	dill_bned(s, conditional, tmp, target_label);	/* op_i_bned */
	break;
    }
    default:
	fprintf(stderr, "unhandled case in gen_bnz\n");
    }
}